

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_connection.c
# Opt level: O0

_Bool is_greeting_accepted(uint8_t *msg_data,apx_size_t msg_size,apx_error_t *error_code)

{
  apx_size_t aVar1;
  uint32_t local_40;
  apx_size_t decode_size;
  uint32_t cmd_type;
  apx_size_t header_size;
  uint8_t *msg_end;
  _Bool more_bit;
  apx_error_t *paStack_28;
  uint32_t address;
  apx_error_t *error_code_local;
  uint8_t *puStack_18;
  apx_size_t msg_size_local;
  uint8_t *msg_data_local;
  
  msg_end._3_1_ = 0;
  _cmd_type = msg_data + msg_size;
  paStack_28 = error_code;
  error_code_local._4_4_ = msg_size;
  puStack_18 = msg_data;
  decode_size = rmf_address_decode(msg_data,msg_data + msg_size,(uint32_t *)((long)&msg_end + 4),
                                   (_Bool *)((long)&msg_end + 3));
  if (msg_end._4_4_ == 0x3ffffc00) {
    local_40 = 0;
    aVar1 = rmf_decode_cmd_type(puStack_18 + decode_size,_cmd_type,&local_40);
    if ((aVar1 == 4) && (local_40 == 0)) {
      return true;
    }
  }
  else {
    *paStack_28 = 0x2c;
  }
  return false;
}

Assistant:

static bool is_greeting_accepted(uint8_t const* msg_data, apx_size_t msg_size, apx_error_t* error_code)
{
   uint32_t address;
   bool more_bit = false;
   uint8_t const* const msg_end = msg_data + msg_size;
   apx_size_t header_size = rmf_address_decode(msg_data, msg_data + msg_size, &address, &more_bit);
   if (address == RMF_CMD_AREA_START_ADDRESS)
   {
      uint32_t cmd_type = 0u;
      apx_size_t decode_size = rmf_decode_cmd_type(msg_data + header_size, msg_end, &cmd_type);
      if ((decode_size == RMF_CMD_TYPE_SIZE) && (cmd_type ==RMF_CMD_ACK_MSG))
      {
         return true;
      }
   }
   else
   {
      *error_code = APX_INVALID_MSG_ERROR;
   }
   return false;
}